

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_storage.cpp
# Opt level: O3

int __thiscall
libtorrent::aux::mmap_storage::hash
          (mmap_storage *this,settings_interface *sett,hasher *ph,ptrdiff_t len,piece_index_t piece,
          int offset,open_mode_t mode,disk_job_flags_t flags,storage_error *error)

{
  pointer psVar1;
  span<const_char> range;
  bool bVar2;
  undefined1 uVar3;
  char cVar4;
  open_mode_t mode_00;
  file_index_t fVar5;
  int iVar6;
  uint uVar7;
  int64_t iVar8;
  undefined8 uVar9;
  int iVar10;
  disk_job *pdVar11;
  mmap_storage *f;
  file_storage *pfVar12;
  storage_error *ec;
  file_storage *this_00;
  long lVar13;
  span<const_char> range_00;
  span<const_char> data;
  peer_request pVar14;
  span<char> buf;
  shared_ptr<libtorrent::aux::file_mapping> handle;
  vector<char,_std::allocator<char>_> scratch;
  int local_ac;
  undefined1 local_98 [4];
  uint uStack_94;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  file_mapping *local_88;
  disk_job *local_80;
  vector<char,_std::allocator<char>_> local_78;
  undefined8 local_58 [3];
  sig local_40 [8];
  undefined8 *local_38;
  
  local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_00 = (this->m_mapped_files)._M_t.
            super___uniq_ptr_impl<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>
            ._M_t.
            super__Tuple_impl<0UL,_libtorrent::file_storage_*,_std::default_delete<libtorrent::file_storage>_>
            .super__Head_base<0UL,_libtorrent::file_storage_*,_false>._M_head_impl;
  if (this_00 == (file_storage *)0x0) {
    this_00 = this->m_files;
  }
  lVar13 = (long)offset + (long)this_00->m_piece_length * (long)piece.m_val;
  local_58[2] = sett;
  mode_00.m_val = (uint)file_storage::file_index_at_offset(this_00,lVar13);
  iVar8 = file_storage::file_offset(this_00,(file_index_t)mode_00.m_val);
  if (len < 1) {
    local_ac = 0;
  }
  else {
    lVar13 = lVar13 - iVar8;
    local_ac = 0;
    do {
      iVar8 = file_storage::file_size(this_00,(file_index_t)mode_00.m_val);
      iVar6 = (int)len;
      iVar10 = iVar6;
      if (iVar8 < iVar6 + lVar13) {
        iVar8 = file_storage::file_size(this_00,(file_index_t)mode_00.m_val);
        iVar10 = (int)iVar8 - (int)lVar13;
        if (iVar10 < 1) {
          iVar10 = 0;
        }
      }
      if (iVar10 == 0) {
        do {
          mode_00.m_val = mode_00.m_val + 1;
          fVar5 = file_storage::end_file(this_00);
          if (fVar5.m_val <= (int)mode_00.m_val) goto LAB_0023064f;
          iVar8 = file_storage::file_size(this_00,(file_index_t)mode_00.m_val);
        } while (iVar8 == 0);
        iVar8 = file_storage::file_size(this_00,(file_index_t)mode_00.m_val);
        iVar10 = iVar6;
        if (iVar8 < iVar6) {
          iVar8 = file_storage::file_size(this_00,(file_index_t)mode_00.m_val);
          iVar10 = (int)iVar8;
          if (iVar10 < 1) {
            iVar10 = 0;
          }
        }
        lVar13 = 0;
      }
      pfVar12 = (this->m_mapped_files)._M_t.
                super___uniq_ptr_impl<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>
                ._M_t.
                super__Tuple_impl<0UL,_libtorrent::file_storage_*,_std::default_delete<libtorrent::file_storage>_>
                .super__Head_base<0UL,_libtorrent::file_storage_*,_false>._M_head_impl;
      if (pfVar12 == (file_storage *)0x0) {
        pfVar12 = this->m_files;
      }
      bVar2 = file_storage::pad_file_at(pfVar12,(file_index_t)mode_00.m_val);
      pdVar11 = (disk_job *)(long)iVar10;
      if (bVar2) {
        iVar6 = hash_zeroes(ph,(int64_t)pdVar11);
      }
      else {
        psVar1 = (this->m_file_priority).
                 super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                 .
                 super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_80 = pdVar11;
        if ((((int)mode_00.m_val <
              *(int *)&(this->m_file_priority).
                       super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                       .
                       super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (int)psVar1) &&
            (psVar1[(int)mode_00.m_val].m_val == '\0')) &&
           (bVar2 = use_partfile(this,(file_index_t)mode_00.m_val), bVar2)) {
          local_98 = (undefined1  [4])0x0;
          uStack_94 = uStack_94 & 0xffffff00;
          _Stack_90._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               &boost::system::detail::cat_holder<void>::system_category_instance;
          pfVar12 = (this->m_mapped_files)._M_t.
                    super___uniq_ptr_impl<libtorrent::file_storage,_std::default_delete<libtorrent::file_storage>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_libtorrent::file_storage_*,_std::default_delete<libtorrent::file_storage>_>
                    .super__Head_base<0UL,_libtorrent::file_storage_*,_false>._M_head_impl;
          if (pfVar12 == (file_storage *)0x0) {
            pfVar12 = this->m_files;
          }
          pVar14 = file_storage::map_file(pfVar12,(file_index_t)mode_00.m_val,lVar13,0);
          iVar6 = part_file::hash((this->m_part_file)._M_t.
                                  super___uniq_ptr_impl<libtorrent::aux::part_file,_std::default_delete<libtorrent::aux::part_file>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_libtorrent::aux::part_file_*,_std::default_delete<libtorrent::aux::part_file>_>
                                  .super__Head_base<0UL,_libtorrent::aux::part_file_*,_false>.
                                  _M_head_impl,ph,(ptrdiff_t)local_80,pVar14.piece.m_val,
                                  pVar14.start,(error_code *)local_98);
          if (uStack_94._0_1_ == true) {
            (error->ec).val_ = (int)local_98;
            (error->ec).failed_ = (bool)(char)uStack_94;
            *(int3 *)&(error->ec).field_0x5 = (int3)(uStack_94 >> 8);
            (error->ec).cat_ = (error_category *)_Stack_90._M_pi;
            error->operation = partfile_read;
            iVar6 = -1;
          }
        }
        else {
          f = this;
          ec = error;
          open_file((mmap_storage *)local_98,(settings_interface *)this,
                    (file_index_t)(int)local_58[2],mode_00,(storage_error *)(ulong)mode.m_val);
          uVar9 = (disk_job *)0xffffffff;
          if ((error->ec).val_ == 0) {
            local_88 = (file_mapping *)CONCAT44(uStack_94,local_98);
            if (local_88->m_mapping == (void *)0x0) {
              ::std::vector<char,_std::allocator<char>_>::resize(&local_78,(size_type)local_80);
              buf.m_ptr = local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish +
                          -(long)local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start;
              buf.m_len = lVar13;
              uVar7 = pread_all((aux *)(ulong)(uint)(local_88->m_file).m_fd,
                                (handle_type)
                                local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start,buf,(int64_t)error,&ec->ec);
              if ((error->ec).val_ == 0) {
                data.m_len = (long)local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_start;
                uVar9 = ZEXT48(uVar7);
                data.m_ptr = local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start;
                lcrypto::hasher::update(ph,data);
              }
            }
            else {
              uVar9 = (disk_job *)0x0;
              pdVar11 = (disk_job *)(local_88->m_size - lVar13);
              if (pdVar11 != (disk_job *)0x0 && lVar13 <= local_88->m_size) {
                local_58[1] = local_80;
                if ((long)pdVar11 < (long)local_80) {
                  local_58[1] = pdVar11;
                }
                local_58[0] = (long)local_88->m_mapping + lVar13;
                local_38 = local_58;
                local_40 = (sig  [8])ph;
                sig::operator()(local_40,(anon_class_16_2_14dc695b *)f);
                uVar9 = local_58[1];
                if ((flags.m_val & 0x10) != 0) {
                  range_00.m_len = local_58[1];
                  range_00.m_ptr = (char *)local_58[0];
                  file_mapping::dont_need(local_88,range_00);
                }
                if ((char)flags.m_val < '\0') {
                  range.m_len = local_58[1];
                  range.m_ptr = (char *)local_58[0];
                  file_mapping::page_out(local_88,range);
                }
              }
            }
          }
          iVar6 = (int)uVar9;
          if (_Stack_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_90._M_pi);
          }
        }
      }
      uVar3 = (undefined1)(mode_00.m_val >> 0x10);
      if ((error->ec).val_ != 0) {
        *(short *)&error->field_0x10 = (short)mode_00.m_val;
        error->field_0x12 = uVar3;
        break;
      }
      if ((0 < iVar10) && (iVar6 == 0)) {
        error->operation = file_read;
        if ((DAT_004ecee8 == -0x70502de1da3a1f65) || (DAT_004ecee8 == -0x4d54ee85da8120f3)) {
LAB_002304f0:
          uVar9 = 0x100000002;
        }
        else {
          cVar4 = (**(code **)(boost::asio::error::get_misc_category()::instance + 0x30))
                            (&boost::asio::error::get_misc_category()::instance,2);
          uVar9 = 2;
          if (cVar4 != '\0') goto LAB_002304f0;
        }
        (error->ec).val_ = (int)uVar9;
        (error->ec).failed_ = (bool)(char)((ulong)uVar9 >> 0x20);
        *(int3 *)&(error->ec).field_0x5 = (int3)((ulong)uVar9 >> 0x28);
        (error->ec).cat_ = (error_category *)&boost::asio::error::get_misc_category()::instance;
        *(short *)&error->field_0x10 = (short)mode_00.m_val;
        error->field_0x12 = uVar3;
      }
      len = len - iVar6;
      lVar13 = lVar13 + iVar6;
      local_ac = local_ac + iVar6;
    } while (0 < len);
  }
LAB_0023064f:
  if ((disk_job *)
      local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (disk_job *)0x0) {
    operator_delete(local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_ac;
}

Assistant:

int mmap_storage::hash(settings_interface const& sett
		, hasher& ph, std::ptrdiff_t const len
		, piece_index_t const piece, int const offset
		, aux::open_mode_t const mode
		, disk_job_flags_t const flags
		, storage_error& error)
	{
#ifdef TORRENT_SIMULATE_SLOW_READ
		std::this_thread::sleep_for(milliseconds(rand() % 2000));
#endif

		char dummy;
		std::vector<char> scratch;

		return readwrite(files(), span<char const>{&dummy, len}, piece, offset, error
			, [this, mode, flags, &ph, &sett, &scratch](file_index_t const file_index
				, std::int64_t const file_offset
				, span<char const> const buf, storage_error& ec)
		{
			if (files().pad_file_at(file_index))
				return aux::hash_zeroes(ph, buf.size());

			if (file_index < m_file_priority.end_index()
				&& m_file_priority[file_index] == dont_download
				&& use_partfile(file_index))
			{
				error_code e;
				peer_request map = files().map_file(file_index, file_offset, 0);
				int const ret = m_part_file->hash(ph, buf.size()
					, map.piece, map.start, e);

				if (e)
				{
					ec.ec = e;
					ec.operation = operation_t::partfile_read;
					return -1;
				}
				return ret;
			}

			auto handle = open_file(sett, file_index, mode, ec);
			if (ec) return -1;

			if (!handle->has_memory_map())
			{
				scratch.resize(std::size_t(buf.size()));
				int const ret = aux::pread_all(handle->fd(), scratch, file_offset, ec.ec);
				if (ec) return -1;
				ph.update(scratch);
				return ret;
			}

			int ret = 0;
			span<byte const> file_range = handle->range();
			if (file_range.size() > file_offset)
			{
				file_range = file_range.subspan(std::ptrdiff_t(file_offset)
					, std::min(buf.size(), std::ptrdiff_t(file_range.size() - file_offset)));

				sig::try_signal([&]{
					ph.update({const_cast<char const*>(file_range.data()), file_range.size()});
				});
				ret += static_cast<int>(file_range.size());
				if (flags & disk_interface::volatile_read)
					handle->dont_need(file_range);
				if (flags & disk_interface::flush_piece)
					handle->page_out(file_range);
			}

			return ret;
		});
	}